

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O1

void WcsicmpNegativeTest(void)

{
  AssertionResult iutest_ar;
  wchar_t negative_sample [5];
  int *in_stack_fffffffffffffdc8;
  AssertionResult local_230;
  AssertionHelper local_208;
  wchar_t local_1d8 [8];
  undefined1 local_1b8 [432];
  
  local_1d8[0] = L'a';
  local_1d8[1] = L'a';
  local_1d8[2] = L'a';
  local_1d8[3] = L'\xffffffff';
  local_1d8[4] = 0;
  local_1b8._0_4_ = 0;
  local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       wcscasecmp(L"AAA",local_1d8);
  if ((int)local_1b8._0_4_ <
      (int)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) {
    local_230.m_message._M_dataplus._M_p = (pointer)&local_230.m_message.field_2;
    local_230.m_message._M_string_length = 0;
    local_230.m_message.field_2._M_local_buf[0] = '\0';
    local_230.m_result = true;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_230,(internal *)0x171a14,
               "::iutest::detail::iu_wcsicmp(L\"AAA\", negative_sample)","<",local_1b8,
               (int *)&local_208,in_stack_fffffffffffffdc8);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdcf);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x31;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_208.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != &local_230.m_message.field_2) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    CONCAT71(local_230.m_message.field_2._M_allocated_capacity._1_7_,
                             local_230.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void WcsicmpNegativeTest()
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME_GE(sizeof(::std::wint_t), sizeof(int));
    IUTEST_EXPECT_LT(0, ::iutest::detail::iu_wcsicmp(L"AAA", negative_sample));
}